

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismModel::_build_k4_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,bool pattern)

{
  uint uVar1;
  bool bVar2;
  int *in_RCX;
  uint in_EDX;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *in_RSI;
  long in_RDI;
  byte in_R8B;
  uint y;
  value_type cn2;
  uint x;
  value_type cn1;
  bool done;
  uint count;
  value_type common_neighbours;
  uint w;
  value_type nv;
  uint v;
  SVOBitset *in_stack_fffffffffffffd28;
  SVOBitset *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  uint in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  undefined2 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd42;
  byte in_stack_fffffffffffffd43;
  uint in_stack_fffffffffffffd44;
  uint in_stack_fffffffffffffd48;
  uint in_stack_fffffffffffffd4c;
  uint in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  allocator<char> *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  uint local_274;
  uint local_1e4;
  byte local_155;
  uint local_b4;
  uint local_28;
  
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
              (in_RSI,(ulong)(local_28 * *(int *)(in_RDI + 8)));
    SVOBitset::SVOBitset(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    for (local_b4 = 0; local_b4 < local_28; local_b4 = local_b4 + 1) {
      bVar2 = SVOBitset::test((SVOBitset *)
                              CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                              in_stack_fffffffffffffd4c);
      in_stack_fffffffffffffd54 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd54);
      if (bVar2) {
        std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                  (in_RSI,(ulong)(local_b4 * *(int *)(in_RDI + 8)));
        SVOBitset::SVOBitset(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        SVOBitset::operator&=
                  ((SVOBitset *)
                   CONCAT44(in_stack_fffffffffffffd44,
                            CONCAT13(in_stack_fffffffffffffd43,
                                     CONCAT12(in_stack_fffffffffffffd42,in_stack_fffffffffffffd40)))
                   ,(SVOBitset *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        SVOBitset::reset((SVOBitset *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         in_stack_fffffffffffffd4c);
        SVOBitset::reset((SVOBitset *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         in_stack_fffffffffffffd4c);
        in_stack_fffffffffffffd50 =
             SVOBitset::count((SVOBitset *)
                              CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        if (1 < in_stack_fffffffffffffd50) {
          local_155 = 0;
          SVOBitset::SVOBitset(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
          in_stack_fffffffffffffd4c =
               SVOBitset::find_first
                         ((SVOBitset *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                         );
          local_1e4 = in_stack_fffffffffffffd4c;
          while( true ) {
            uVar1 = in_stack_fffffffffffffd48 & 0xffffff;
            if (local_1e4 != 0xffffffff) {
              uVar1 = CONCAT13(local_155,(int3)in_stack_fffffffffffffd48) ^ 0xff000000;
            }
            in_stack_fffffffffffffd48 = uVar1;
            if ((in_stack_fffffffffffffd48 & 0x1000000) == 0) break;
            SVOBitset::reset((SVOBitset *)
                             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                             in_stack_fffffffffffffd4c);
            SVOBitset::SVOBitset(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
            in_stack_fffffffffffffd44 =
                 SVOBitset::find_first
                           ((SVOBitset *)
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
            local_274 = in_stack_fffffffffffffd44;
            while( true ) {
              in_stack_fffffffffffffd43 = 0;
              if (local_274 != 0xffffffff) {
                in_stack_fffffffffffffd43 = local_155 ^ 0xff;
              }
              if ((in_stack_fffffffffffffd43 & 1) == 0) break;
              SVOBitset::reset((SVOBitset *)
                               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                               in_stack_fffffffffffffd4c);
              if ((((local_28 != local_b4) && (local_28 != local_1e4)) && (local_28 != local_274))
                 && ((local_b4 != local_1e4 && (local_b4 != local_274)))) {
                std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                operator[](in_RSI,(ulong)(local_1e4 * *(int *)(in_RDI + 8)));
                in_stack_fffffffffffffd42 =
                     SVOBitset::test((SVOBitset *)
                                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                     in_stack_fffffffffffffd4c);
                if ((bool)in_stack_fffffffffffffd42) {
                  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                  operator[](in_RSI,(ulong)(local_28 * *(int *)(in_RDI + 8) + *in_RCX));
                  SVOBitset::set((SVOBitset *)
                                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                 in_stack_fffffffffffffd4c);
                  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                  operator[](in_RSI,(ulong)(local_b4 * *(int *)(in_RDI + 8) + *in_RCX));
                  SVOBitset::set((SVOBitset *)
                                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                 in_stack_fffffffffffffd4c);
                  local_155 = 1;
                }
              }
              in_stack_fffffffffffffd3c =
                   SVOBitset::find_first
                             ((SVOBitset *)
                              CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
              local_274 = in_stack_fffffffffffffd3c;
            }
            SVOBitset::~SVOBitset(in_stack_fffffffffffffd30);
            in_stack_fffffffffffffd38 =
                 SVOBitset::find_first
                           ((SVOBitset *)
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
            local_1e4 = in_stack_fffffffffffffd38;
          }
          SVOBitset::~SVOBitset(in_stack_fffffffffffffd30);
        }
        SVOBitset::~SVOBitset(in_stack_fffffffffffffd30);
      }
    }
    SVOBitset::~SVOBitset(in_stack_fffffffffffffd30);
  }
  if ((in_R8B & 1) != 0) {
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x1698a3);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xfffffffffffffd67;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffd44,
                            CONCAT13(in_stack_fffffffffffffd43,
                                     CONCAT12(in_stack_fffffffffffffd42,in_stack_fffffffffffffd40)))
                ,(value_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd67);
  }
  *in_RCX = *in_RCX + 1;
  return;
}

Assistant:

auto HomomorphismModel::_build_k4_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx, bool pattern) -> void
{
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        for (unsigned w = 0; w < v; ++w) {
            if (nv.test(w)) {
                // are there two common neighbours with an edge between them?
                auto common_neighbours = graph_rows[w * max_graphs + 0];
                common_neighbours &= nv;
                common_neighbours.reset(v);
                common_neighbours.reset(w);
                auto count = common_neighbours.count();
                if (count >= 2) {
                    bool done = false;
                    auto cn1 = common_neighbours;
                    for (auto x = cn1.find_first(); x != decltype(cn1)::npos && ! done; x = cn1.find_first()) {
                        cn1.reset(x);
                        auto cn2 = common_neighbours;
                        for (auto y = cn2.find_first(); y != decltype(cn2)::npos && ! done; y = cn2.find_first()) {
                            cn2.reset(y);
                            if (v != w && v != x && v != y && w != x && w != y && graph_rows[x * max_graphs + 0].test(y)) {
                                graph_rows[v * max_graphs + idx].set(w);
                                graph_rows[w * max_graphs + idx].set(v);
                                done = true;
                            }
                        }
                    }
                }
            }
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("k4");
    ++idx;
}